

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O2

Import * __thiscall flatbuffers::python::Imports::Import(Imports *this,string *module)

{
  pointer pIVar1;
  Import import;
  Import local_48;
  
  local_48.module._M_dataplus._M_p = (pointer)&local_48.module.field_2;
  local_48.module._M_string_length = 0;
  local_48.module.field_2._M_local_buf[0] = '\0';
  local_48.name._M_dataplus._M_p = (pointer)&local_48.name.field_2;
  local_48.name._M_string_length = 0;
  local_48.name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&local_48);
  std::vector<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>::
  emplace_back<flatbuffers::python::Import>(&this->imports,&local_48);
  pIVar1 = (this->imports).
           super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  python::Import::~Import(&local_48);
  return pIVar1 + -1;
}

Assistant:

const python::Import &python::Imports::Import(const std::string &module) {
  python::Import import;
  import.module = module;
  imports.push_back(std::move(import));
  return imports.back();
}